

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O2

bool QSharedMemory::isKeyTypeSupported(Type type)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,type);
  if (iVar2 == 0x101) {
    return false;
  }
  if (iVar2 != 0x100) {
    bVar1 = QSharedMemorySystemV::runtimeSupportCheck();
    return bVar1;
  }
  if (QSharedMemoryPosix::runtimeSupportCheck()::result == '\0') {
    iVar2 = __cxa_guard_acquire(&QSharedMemoryPosix::runtimeSupportCheck()::result);
    if (iVar2 != 0) {
      shm_open("",0,0);
      piVar3 = __errno_location();
      QSharedMemoryPosix::runtimeSupportCheck::result = *piVar3 != 0x26;
      __cxa_guard_release(&QSharedMemoryPosix::runtimeSupportCheck()::result);
    }
  }
  return QSharedMemoryPosix::runtimeSupportCheck::result;
}

Assistant:

bool QSharedMemory::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SharedMemory, type))
        return false;
    using Variant = decltype(QSharedMemoryPrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}